

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  char *pcVar13;
  
  pcVar13 = GF2::Env::Version();
  GF2::Env::Print("gf2/test [gf2 version %s]\n",pcVar13);
  bVar1 = GF2::Env::RunTest("testWW",testWW);
  bVar2 = GF2::Env::RunTest("testMP",testMP);
  bVar3 = GF2::Env::RunTest("testOder",testOrder);
  bVar4 = GF2::Env::RunTest("testBFunc",testBFunc);
  bVar5 = GF2::Env::RunTest("testBent",testBent);
  bVar6 = GF2::Env::RunTest("testBent2",testBent2);
  bVar7 = GF2::Env::RunTest("testGOST",testGOST);
  bVar8 = GF2::Env::RunTest("testBelt",testBelt,true);
  bVar9 = GF2::Env::RunTest("testBash",testBash);
  bVar10 = GF2::Env::RunTest("testBash2",testBash2);
  bVar11 = GF2::Env::RunTest("testCommute",testCommute);
  bVar12 = GF2::Env::RunTest("testEM",testEM);
  return (int)(!bVar12 ||
              ((!bVar11 || (!bVar10 || (!bVar9 || !bVar8))) ||
              ((!bVar7 || (!bVar6 || !bVar5)) || ((!bVar4 || !bVar3) || (!bVar2 || !bVar1)))));
}

Assistant:

int main()
{
	int ret = 0;
	Env::Print("gf2/test [gf2 version %s]\n", Env::Version());
	ret |= !Env::RunTest("testWW", testWW);
	ret |= !Env::RunTest("testMP", testMP);
	ret |= !Env::RunTest("testOder", testOrder);
	ret |= !Env::RunTest("testBFunc", testBFunc);
	ret |= !Env::RunTest("testBent", testBent);
	ret |= !Env::RunTest("testBent2", testBent2);
	ret |= !Env::RunTest("testGOST", testGOST);
	ret |= !Env::RunTest("testBelt", testBelt, true);
	ret |= !Env::RunTest("testBash", testBash);
	ret |= !Env::RunTest("testBash2", testBash2);
	ret |= !Env::RunTest("testCommute", testCommute);
	ret |= !Env::RunTest("testEM", testEM);
	return ret;
}